

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ostream *os;
  ulong uVar1;
  long lVar2;
  Column local_60;
  
  uVar1 = std::__cxx11::string::find((char *)_string,0x25c1e7);
  lVar2 = uVar1 + 2;
  if (0x13 < uVar1) {
    lVar2 = 0;
  }
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  TextFlow::Column::Column(&local_60,_string);
  local_60.m_indent = lVar2 + indent;
  local_60.m_initialIndent = indent;
  TextFlow::operator<<(os,&local_60);
  std::operator<<(os,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    // We want to get a bit fancy with line breaking here, so that subsequent
    // lines start after ":" if one is present, e.g.
    // ```
    // blablabla: Fancy
    //            linebreaking
    // ```
    // but we also want to avoid problems with overly long indentation causing
    // the text to take up too many lines, e.g.
    // ```
    // blablabla: F
    //            a
    //            n
    //            c
    //            y
    //            .
    //            .
    //            .
    // ```
    // So we limit the prefix indentation check to first quarter of the possible
    // width
    std::size_t idx = _string.find( ": " );
    if ( idx != std::string::npos && idx < CATCH_CONFIG_CONSOLE_WIDTH / 4 ) {
        idx += 2;
    } else {
        idx = 0;
    }
    m_stream << TextFlow::Column( _string )
                  .indent( indent + idx )
                  .initialIndent( indent )
           << '\n';
}